

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_xmlmodelserialiser.cpp
# Opt level: O1

void __thiscall tst_XmlModelSerialiser::basicSaveLoadByteArray(tst_XmlModelSerialiser *this)

{
  QAbstractItemModel *sourceModel;
  QAbstractItemModel *destinationModel;
  __atomic_base<int> _Var1;
  undefined8 *puVar2;
  XmlModelSerialiser serialiser;
  QMetaTypeInterface *local_38 [3];
  
  local_38[0] = &QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType;
  _Var1._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType.typeId.
               _q_value.super___atomic_base<int>._M_i;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var1._M_i = QMetaType::idHelper();
  }
  puVar2 = (undefined8 *)QTest::qData("sourceModel",_Var1._M_i);
  sourceModel = (QAbstractItemModel *)*puVar2;
  local_38[0] = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType;
  _Var1._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var1._M_i = QMetaType::idHelper();
  }
  puVar2 = (undefined8 *)QTest::qData("destinationModel",_Var1._M_i);
  destinationModel = (QAbstractItemModel *)*puVar2;
  XmlModelSerialiser::XmlModelSerialiser((XmlModelSerialiser *)local_38,(QObject *)0x0);
  tst_SerialiserCommon::saveLoadByteArray
            (&this->super_tst_SerialiserCommon,(AbstractModelSerialiser *)local_38,sourceModel,
             destinationModel,true,true);
  QObject::deleteLater();
  XmlModelSerialiser::~XmlModelSerialiser((XmlModelSerialiser *)local_38);
  return;
}

Assistant:

void tst_XmlModelSerialiser::basicSaveLoadByteArray()
{
    QFETCH(const QAbstractItemModel *, sourceModel);
    QFETCH(QAbstractItemModel *, destinationModel);
    XmlModelSerialiser serialiser;
    saveLoadByteArray(&serialiser, sourceModel, destinationModel, true);
    destinationModel->deleteLater();
}